

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O2

Vec_Ptr_t * Llb_ManFlow(Aig_Man_t *p,Vec_Ptr_t *vSources,int *pnFlow)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  Vec_Ptr_t *vMinCut;
  int iVar4;
  Aig_Obj_t *pAVar5;
  int iVar6;
  
  Aig_ManCleanData(p);
  Aig_ManIncrementTravId(p);
  iVar6 = 0;
  iVar4 = 0;
  while( true ) {
    if (vSources->nSize <= iVar4) {
      if (pnFlow != (int *)0x0) {
        *pnFlow = iVar6;
      }
      Aig_ManIncrementTravId(p);
      iVar4 = 0;
      while( true ) {
        if (vSources->nSize <= iVar4) {
          vMinCut = Llb_ManFlowMinCut(p);
          if (vMinCut->nSize == iVar6) {
            iVar4 = Llb_ManFlowVerifyCut(p,vMinCut);
            if (iVar4 == 0) {
              puts("Llb_ManFlow() error! The computed min-cut is not a cut!");
            }
            return vMinCut;
          }
          __assert_fail("Vec_PtrSize(vMinCut) == Flow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                        ,0x32b,"Vec_Ptr_t *Llb_ManFlow(Aig_Man_t *, Vec_Ptr_t *, int *)");
        }
        pvVar3 = Vec_PtrEntry(vSources,iVar4);
        uVar2 = (uint)*(undefined8 *)((long)pvVar3 + 0x18);
        if ((uVar2 & 0x30) != 0x20) break;
        pAVar5 = (Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe);
        if ((pAVar5->field_0x18 & 0x20) == 0) {
          iVar1 = Llb_ManFlowBwdPath2_rec(p,pAVar5);
          if (iVar1 != 0) {
            __assert_fail("RetValue == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                          ,800,"Vec_Ptr_t *Llb_ManFlow(Aig_Man_t *, Vec_Ptr_t *, int *)");
          }
          uVar2 = (uint)*(undefined8 *)((long)pvVar3 + 0x18);
        }
        if ((0xfffffffd < (uVar2 & 7) - 7) &&
           (pAVar5 = (Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe),
           (pAVar5->field_0x18 & 0x20) == 0)) {
          iVar1 = Llb_ManFlowBwdPath2_rec(p,pAVar5);
          if (iVar1 != 0) {
            __assert_fail("RetValue == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                          ,0x325,"Vec_Ptr_t *Llb_ManFlow(Aig_Man_t *, Vec_Ptr_t *, int *)");
          }
        }
        iVar4 = iVar4 + 1;
      }
      __assert_fail("!pObj->fMarkA && pObj->fMarkB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                    ,0x31c,"Vec_Ptr_t *Llb_ManFlow(Aig_Man_t *, Vec_Ptr_t *, int *)");
    }
    pvVar3 = Vec_PtrEntry(vSources,iVar4);
    if ((*(uint *)((long)pvVar3 + 0x18) & 0x30) != 0x20) break;
    pAVar5 = (Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe);
    if ((pAVar5->field_0x18 & 0x20) == 0) {
      iVar1 = Llb_ManFlowBwdPath2_rec(p,pAVar5);
      iVar6 = iVar6 + iVar1;
      if (iVar1 != 0) {
        Aig_ManIncrementTravId(p);
      }
    }
    if ((0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7) &&
       (pAVar5 = (Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe),
       (pAVar5->field_0x18 & 0x20) == 0)) {
      iVar1 = Llb_ManFlowBwdPath2_rec(p,pAVar5);
      iVar6 = iVar6 + iVar1;
      if (iVar1 != 0) {
        Aig_ManIncrementTravId(p);
      }
    }
    iVar4 = iVar4 + 1;
  }
  __assert_fail("!pObj->fMarkA && pObj->fMarkB",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                ,0x305,"Vec_Ptr_t *Llb_ManFlow(Aig_Man_t *, Vec_Ptr_t *, int *)");
}

Assistant:

Vec_Ptr_t * Llb_ManFlow( Aig_Man_t * p, Vec_Ptr_t * vSources, int * pnFlow )
{
    Vec_Ptr_t * vMinCut;
    Aig_Obj_t * pObj;
    int Flow, FlowCur, RetValue, i;
    // find the max-flow
    Flow = 0;
    Aig_ManCleanData( p );
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vSources, pObj, i )
    {
        assert( !pObj->fMarkA && pObj->fMarkB );
        if ( !Aig_ObjFanin0(pObj)->fMarkB )
        {
            FlowCur  = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin0(pObj) );
            Flow    += FlowCur;
            if ( FlowCur )
                Aig_ManIncrementTravId(p);
        }
        if ( Aig_ObjIsNode(pObj) && !Aig_ObjFanin1(pObj)->fMarkB )
        {
            FlowCur  = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin1(pObj) );
            Flow    += FlowCur;
            if ( FlowCur )
                Aig_ManIncrementTravId(p);
        }
    }
    if ( pnFlow )
        *pnFlow = Flow;

    // mark the nodes reachable from the latches
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vSources, pObj, i )
    {
        assert( !pObj->fMarkA && pObj->fMarkB );
        if ( !Aig_ObjFanin0(pObj)->fMarkB )
        {
            RetValue = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin0(pObj) );
            assert( RetValue == 0 );
        }
        if ( Aig_ObjIsNode(pObj) && !Aig_ObjFanin1(pObj)->fMarkB )
        {
            RetValue = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin1(pObj) );
            assert( RetValue == 0 );
        }
    }

    // find the min-cut with the smallest volume
    vMinCut = Llb_ManFlowMinCut( p );
    assert( Vec_PtrSize(vMinCut) == Flow );
    // verify the cut
    if ( !Llb_ManFlowVerifyCut(p, vMinCut) )
        printf( "Llb_ManFlow() error! The computed min-cut is not a cut!\n" );
//    Llb_ManFlowPrintCut( p, vMinCut );
    return vMinCut;
}